

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUtil.c
# Opt level: O0

void Abc_SclReadTimingConstr(Abc_Frame_t *pAbc,char *pFileName,int fVerbose)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  float fVar3;
  double dVar4;
  FILE *pFile;
  char *pToken;
  char Buffer [1000];
  int fVerbose_local;
  char *pFileName_local;
  Abc_Frame_t *pAbc_local;
  
  Buffer._996_4_ = fVerbose;
  __stream = fopen(pFileName,"rb");
  while (pcVar2 = fgets((char *)&pToken,1000,__stream), pcVar2 != (char *)0x0) {
    pcVar2 = strtok((char *)&pToken," \t\r\n");
    if (pcVar2 != (char *)0x0) {
      iVar1 = strcmp(pcVar2,"default_input_cell");
      if (iVar1 == 0) {
        pcVar2 = strtok((char *)0x0," \t\r\n");
        pcVar2 = Abc_UtilStrsav(pcVar2);
        Abc_FrameSetDrivingCell(pcVar2);
        if (Buffer._996_4_ != 0) {
          pcVar2 = Abc_FrameReadDrivingCell();
          printf("Setting driving cell to be \"%s\".\n",pcVar2);
        }
      }
      else {
        iVar1 = strcmp(pcVar2,"default_output_load");
        if (iVar1 == 0) {
          pcVar2 = strtok((char *)0x0," \t\r\n");
          dVar4 = atof(pcVar2);
          Abc_FrameSetMaxLoad((float)dVar4);
          if (Buffer._996_4_ != 0) {
            fVar3 = Abc_FrameReadMaxLoad();
            printf("Setting driving cell to be %f.\n",(double)fVar3);
          }
        }
      }
    }
  }
  fclose(__stream);
  return;
}

Assistant:

void Abc_SclReadTimingConstr( Abc_Frame_t * pAbc, char * pFileName, int fVerbose )
{
    char Buffer[1000], * pToken;
    FILE * pFile = fopen( pFileName, "rb" );
    while ( fgets( Buffer, 1000, pFile ) )
    {
        pToken = strtok( Buffer, " \t\r\n" );
        if ( pToken == NULL )
            continue;
//        if ( !strcmp(pToken, "set_driving_cell") )
        if ( !strcmp(pToken, "default_input_cell") )
        {
            Abc_FrameSetDrivingCell( Abc_UtilStrsav(strtok(NULL, " \t\r\n")) );
            if ( fVerbose ) 
                printf( "Setting driving cell to be \"%s\".\n", Abc_FrameReadDrivingCell() );
        }
//        else if ( !strcmp(pToken, "set_load") )
        else if ( !strcmp(pToken, "default_output_load") )
        {
            Abc_FrameSetMaxLoad( atof(strtok(NULL, " \t\r\n")) );
            if ( fVerbose ) 
                printf( "Setting driving cell to be %f.\n", Abc_FrameReadMaxLoad() );
        }
//        else printf( "Unrecognized token \"%s\".\n", pToken );
    }
    fclose( pFile );
}